

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tester.cpp
# Opt level: O0

void StdSprintf(void)

{
  uint uVar1;
  _Setprecision _Var2;
  ostream *poVar3;
  char *__format;
  rep rVar4;
  uint local_140c;
  result_type i;
  uint _i;
  Profiler<std::chrono::duration<double,_std::ratio<1L,_1L>_>_> _prof;
  uniform_int_distribution<int> local_13e8;
  uniform_int_distribution<int> _dist;
  random_device _rdev;
  int _imax;
  int _imin;
  ResultType _result;
  char buf [64];
  
  poVar3 = std::operator<<((ostream *)&std::cout,"sprintf");
  poVar3 = std::operator<<(poVar3,"... ");
  std::ostream::operator<<(poVar3,std::flush<char,std::char_traits<char>>);
  std::random_device::random_device((random_device *)&_dist);
  std::uniform_int_distribution<int>::uniform_int_distribution(&local_13e8,-0x80000000,0x7fffffff);
  Profiler<std::chrono::duration<double,_std::ratio<1L,_1L>_>_>::Profiler
            ((Profiler<std::chrono::duration<double,_std::ratio<1L,_1L>_>_> *)&i,
             (duration<double,_std::ratio<1L,_1L>_> *)&_imax);
  for (local_140c = 0; local_140c < 10000000; local_140c = local_140c + 1) {
    uVar1 = std::uniform_int_distribution<int>::operator()(&local_13e8,(random_device *)&_dist);
    __format = PrintfFormat<int>();
    sprintf((char *)&_result,__format,(ulong)uVar1);
  }
  Profiler<std::chrono::duration<double,_std::ratio<1L,_1L>_>_>::~Profiler
            ((Profiler<std::chrono::duration<double,_std::ratio<1L,_1L>_>_> *)&i);
  std::random_device::~random_device((random_device *)&_dist);
  poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,std::fixed);
  _Var2 = std::setprecision(3);
  poVar3 = std::operator<<(poVar3,_Var2);
  rVar4 = std::chrono::duration<double,_std::ratio<1L,_1L>_>::count
                    ((duration<double,_std::ratio<1L,_1L>_> *)&_imax);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,rVar4);
  poVar3 = std::operator<<(poVar3,"s");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void StdSprintf()
{
    char buf[64];
    RANDOM_PROFILING_BEGIN("sprintf")
    sprintf(buf, PrintfFormat<number_t>(), i);
    RANDOM_PROFILING_END()
}